

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

type_caster<bool,_void> *
pybind11::detail::load_type<bool,void>(type_caster<bool,_void> *conv,handle *handle)

{
  bool bVar1;
  cast_error *this;
  handle local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = type_caster<bool,_void>::load(conv,(handle)handle->m_ptr,true);
  if (bVar1) {
    return conv;
  }
  this = (cast_error *)__cxa_allocate_exception(0x10);
  local_e0.m_ptr = (PyObject *)PyObject_Str(handle->m_ptr->ob_type);
  str::operator_cast_to_string(&local_b8,(str *)&local_e0);
  std::operator+(&local_98,"Unable to cast Python instance of type ",&local_b8);
  std::operator+(&local_78,&local_98," to C++ type \'");
  type_id<bool>();
  std::operator+(&local_58,&local_78,&local_d8);
  std::operator+(&local_38,&local_58,"\'");
  cast_error::runtime_error(this,&local_38);
  __cxa_throw(this,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

type_caster<T, SFINAE> &load_type(type_caster<T, SFINAE> &conv, const handle &handle) {
    if (!conv.load(handle, true)) {
#if defined(NDEBUG)
        throw cast_error("Unable to cast Python instance to C++ type (compile in debug mode for details)");
#else
        throw cast_error("Unable to cast Python instance of type " +
            (std::string) str(handle.get_type()) + " to C++ type '" + type_id<T>() + "'");
#endif
    }
    return conv;
}